

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

bool __thiscall
crnlib::task_pool::queue_task(task_pool *this,executable_task *pObj,uint64 data,void *pData_ptr)

{
  bool bVar1;
  undefined1 local_50 [8];
  task tsk;
  void *pData_ptr_local;
  uint64 data_local;
  executable_task *pObj_local;
  task_pool *this_local;
  
  tsk._24_8_ = pData_ptr;
  task::task((task *)local_50);
  tsk.m_data = tsk._24_8_;
  tsk.field_2._0_4_ = 1;
  local_50 = (undefined1  [8])data;
  tsk.m_pData_ptr = pObj;
  atomic_increment32(&this->m_total_submitted_tasks);
  bVar1 = tsstack<crnlib::task_pool::task,_16U>::try_push(&this->m_task_stack,(task *)local_50);
  if (bVar1) {
    semaphore::release(&this->m_tasks_available,1);
  }
  else {
    atomic_increment32(&this->m_total_completed_tasks);
  }
  return bVar1;
}

Assistant:

bool task_pool::queue_task(executable_task* pObj, uint64 data, void* pData_ptr)
    {
        CRNLIB_ASSERT(pObj);

        task tsk;
        tsk.m_pObj = pObj;
        tsk.m_data = data;
        tsk.m_pData_ptr = pData_ptr;
        tsk.m_flags = cTaskFlagObject;

        atomic_increment32(&m_total_submitted_tasks);
        if (!m_task_stack.try_push(tsk))
        {
            atomic_increment32(&m_total_completed_tasks);
            return false;
        }

        m_tasks_available.release(1);

        return true;
    }